

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O3

void __thiscall kj::_::BTreeImpl::erase(BTreeImpl *this,uint row,SearchKey *searchKey)

{
  uint uVar1;
  char acVar2 [7];
  Parent *parent;
  Leaf *pLVar3;
  uint uVar4;
  ulong uVar5;
  MaybeUint *fixup;
  MaybeUint *local_38;
  
  local_38 = (MaybeUint *)0x0;
  uVar4 = this->height;
  if (uVar4 == 0) {
    uVar1 = 0;
    parent = (Parent *)0x0;
    uVar5 = 0;
  }
  else {
    uVar5 = 0;
    parent = (Parent *)0x0;
    uVar1 = 0;
    do {
      parent = eraseHelper<kj::_::BTreeImpl::Parent>
                         (this,(Parent *)(this->tree + uVar5),parent,uVar1,(uint)uVar5,&local_38);
      acVar2 = (**searchKey->_vptr_SearchKey)(searchKey,parent);
      uVar1 = acVar2._0_4_;
      if (((uVar1 < 7) && (parent->keys[uVar1].i == row + 1)) && (local_38 != parent->keys + uVar1))
      {
        local_38 = parent->keys + uVar1;
      }
      uVar5 = (ulong)parent->children[uVar1];
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  pLVar3 = eraseHelper<kj::_::BTreeImpl::Leaf>
                     (this,(Leaf *)(this->tree + uVar5),parent,uVar1,(uint)uVar5,&local_38);
  acVar2 = (*searchKey->_vptr_SearchKey[1])(searchKey,pLVar3);
  uVar1 = acVar2._0_4_;
  if (pLVar3->rows[uVar1].i == row + 1) {
    memmove(pLVar3->rows + uVar1,pLVar3->rows + (ulong)uVar1 + 1,(ulong)(uVar1 + 1) * -4 + 0x38);
    pLVar3->rows[0xd].i = 0;
    if (local_38 != (MaybeUint *)0x0) {
      local_38->i = pLVar3->rows[uVar1 - 1].i;
    }
  }
  else {
    logInconsistency((BTreeImpl *)searchKey);
  }
  return;
}

Assistant:

void BTreeImpl::erase(uint row, const SearchKey& searchKey) {
  // Erase the given row number from the tree. predicate() returns true for the given row and all
  // rows after it.

  uint pos = 0;

  // Track grandparent node and child index within grandparent.
  Parent* parent = nullptr;
  uint indexInParent = 0;

  MaybeUint* fixup = nullptr;

  for (auto i KJ_UNUSED: zeroTo(height)) {
    Parent& node = eraseHelper(tree[pos].parent, parent, indexInParent, pos, fixup);

    parent = &node;
    indexInParent = searchKey.search(node);
    pos = node.children[indexInParent];

    if (indexInParent < kj::size(node.keys) && node.keys[indexInParent] == row) {
      // Oh look, the row is a key in this node! We'll need to come back and fix this up later.
      // Note that any particular row can only appear as *one* key value anywhere in the tree, so
      // we only need one fixup pointer, which is nice.
      MaybeUint* newFixup = &node.keys[indexInParent];
      if (fixup == newFixup) {
        // The fixup pointer was already set while processing a parent node, and then a merge or
        // rotate caused it to be moved, but the fixup pointer was updated... so it's already set
        // to point at the slot we wanted it to point to, so nothing to see here.
      } else {
        KJ_DASSERT(fixup == nullptr);
        fixup = newFixup;
      }
    }
  }

  Leaf& leaf = eraseHelper(tree[pos].leaf, parent, indexInParent, pos, fixup);

  uint r = searchKey.search(leaf);
  if (leaf.rows[r] == row) {
    leaf.erase(r);

    if (fixup != nullptr) {
      // There's a key in a parent node that needs fixup. This is only possible if the removed
      // node is the last in its leaf.
      KJ_DASSERT(leaf.rows[r] == nullptr);
      KJ_DASSERT(r > 0);  // non-root nodes must be at least half full so this can't be item 0
      KJ_DASSERT(*fixup == row);
      *fixup = leaf.rows[r - 1];
    }
  } else {
    logInconsistency();
  }
}